

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-cursor.c
# Opt level: O0

int coda_cursor_get_file_bit_offset(coda_cursor *cursor,int64_t *bit_offset)

{
  coda_backend cVar1;
  int64_t *bit_offset_local;
  coda_cursor *cursor_local;
  
  if (((cursor == (coda_cursor *)0x0) || (cursor->n < 1)) ||
     (cursor->stack[cursor->n + -1].type == (coda_dynamic_type_struct *)0x0)) {
    coda_set_error(-100,"invalid cursor argument (%s:%u)",
                   "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-cursor.c"
                   ,0x724);
    cursor_local._4_4_ = -1;
  }
  else if (bit_offset == (int64_t *)0x0) {
    coda_set_error(-100,"bit_offset argument is NULL (%s:%u)",
                   "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-cursor.c"
                   ,0x72a);
    cursor_local._4_4_ = -1;
  }
  else {
    cVar1 = (cursor->stack[cursor->n + -1].type)->backend;
    if (cVar1 < 2) {
      *bit_offset = cursor->stack[cursor->n + -1].bit_offset;
    }
    else if (cVar1 - coda_backend_memory < 6) {
      *bit_offset = -1;
    }
    cursor_local._4_4_ = 0;
  }
  return cursor_local._4_4_;
}

Assistant:

int coda_cursor_get_file_bit_offset(const coda_cursor *cursor, int64_t *bit_offset)
{
    if (cursor == NULL || cursor->n <= 0 || cursor->stack[cursor->n - 1].type == NULL)
    {
        coda_set_error(CODA_ERROR_INVALID_ARGUMENT, "invalid cursor argument (%s:%u)", __FILE__, __LINE__);
        return -1;
    }

    if (bit_offset == NULL)
    {
        coda_set_error(CODA_ERROR_INVALID_ARGUMENT, "bit_offset argument is NULL (%s:%u)", __FILE__, __LINE__);
        return -1;
    }

    switch (cursor->stack[cursor->n - 1].type->backend)
    {
        case coda_backend_ascii:
        case coda_backend_binary:
            *bit_offset = cursor->stack[cursor->n - 1].bit_offset;
            break;
        case coda_backend_memory:
        case coda_backend_hdf4:
        case coda_backend_hdf5:
        case coda_backend_cdf:
        case coda_backend_netcdf:
        case coda_backend_grib:
            *bit_offset = -1;
            break;
    }

    return 0;
}